

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

float * __thiscall llama_context::get_embeddings_ith(llama_context *this,int32_t i)

{
  runtime_error *prVar1;
  size_type sVar2;
  uint *puVar3;
  uint in_ESI;
  long *in_RDI;
  exception *err;
  int32_t j;
  string local_c0 [39];
  undefined1 local_99;
  string local_98 [39];
  undefined1 local_71;
  string local_70 [39];
  undefined1 local_49;
  string local_48 [48];
  uint local_18;
  uint local_14;
  
  local_18 = 0xffffffff;
  if (in_RDI[0x49] == 0) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar1,"no embeddings");
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_14 = in_ESI;
  if ((int)in_ESI < 0) {
    local_18 = (int)in_RDI[0x50] + in_ESI;
    if ((int)local_18 < 0) {
      local_49 = 1;
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      format_abi_cxx11_((char *)local_48,"negative index out of range [0, %d)",
                        (ulong)*(uint *)(in_RDI + 0x50));
      std::runtime_error::runtime_error(prVar1,local_48);
      local_49 = 0;
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x51));
    if (sVar2 <= (ulong)(long)(int)in_ESI) {
      local_71 = 1;
      prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
      sVar2 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x51));
      format_abi_cxx11_((char *)local_70,"out of range [0, %zu)",sVar2);
      std::runtime_error::runtime_error(prVar1,local_70);
      local_71 = 0;
      __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    puVar3 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x51),
                                (long)(int)local_14);
    local_18 = *puVar3;
  }
  if (-1 < (int)local_18) {
    if ((int)local_18 < (int)in_RDI[0x50]) {
      return (float *)(in_RDI[0x49] + (ulong)(local_18 * *(int *)(*in_RDI + 0x30)) * 4);
    }
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    format_abi_cxx11_((char *)local_c0,"corrupt output buffer (j=%d, n_outputs=%d)",(ulong)local_18,
                      (ulong)*(uint *)(in_RDI + 0x50));
    std::runtime_error::runtime_error(prVar1,local_c0);
    __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_99 = 1;
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
  format_abi_cxx11_((char *)local_98,"batch.logits[%d] != true",(ulong)local_14);
  std::runtime_error::runtime_error(prVar1,local_98);
  local_99 = 0;
  __cxa_throw(prVar1,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

float * llama_context::get_embeddings_ith(int32_t i) {
    int32_t j = -1;

    try {
        if (embd == nullptr) {
            throw std::runtime_error("no embeddings");
        }

        if (i < 0) {
            j = n_outputs + i;
            if (j < 0) {
                throw std::runtime_error(format("negative index out of range [0, %d)", n_outputs));
            }
        } else if ((size_t) i >= output_ids.size()) {
            throw std::runtime_error(format("out of range [0, %zu)", output_ids.size()));
        } else {
            j = output_ids[i];
        }

        if (j < 0) {
            throw std::runtime_error(format("batch.logits[%d] != true", i));
        }
        if (j >= n_outputs) {
            // This should not happen
            throw std::runtime_error(format("corrupt output buffer (j=%d, n_outputs=%d)", j, n_outputs));
        }

        return embd + j*model.hparams.n_embd;
    } catch (const std::exception & err) {
        LLAMA_LOG_ERROR("%s: invalid embeddings id %d, reason: %s\n", __func__, i, err.what());
#ifndef NDEBUG
        GGML_ABORT("fatal error");
#else
        return nullptr;
#endif
    }
}